

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_csv2xlsx.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  __int32_t **pp_Var5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  byte *pbVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uchar bom [3];
  char buf [256];
  char local_1bb;
  char local_1ba;
  char local_1b9;
  ulong local_1b8;
  FILE *local_1b0;
  char *local_1a8;
  int local_19c;
  long local_198;
  int local_18c;
  long local_188;
  undefined8 local_180;
  void *local_178;
  char **local_170;
  char *local_168;
  size_t local_160;
  ulong local_158;
  size_t local_150;
  long local_148;
  undefined8 local_140;
  byte local_138 [264];
  
  if (argc == 1) {
LAB_00101389:
    printf("Usage:  xlsxio_csv2xlsx [-h] [-s separator] [-d rows] [-n] csvfile ...\nParameters:\n  -h          \tdisplay command line help\n  -s separator\tspecify separator to use (default is comma)\n  -d rows     \trows used for column width detection (default is %i)\n  -t          \ttread top row as header row\n  csvfile     \tpath to CSV file (multiple may be specified)\nDescription:\nConverts all specified CSV (Comma Separated Values) files to .xlsx files.\nVersion: 0.2.36\n\n"
           ,0x14);
  }
  else if (1 < argc) {
    bVar13 = 0x2c;
    local_180 = 0;
    local_188 = 0x14;
    local_1b8 = 1;
    local_18c = argc;
    local_170 = argv;
    do {
      iVar14 = (int)local_1b8;
      pbVar12 = (byte *)argv[iVar14];
      bVar17 = *pbVar12;
      bVar3 = bVar13;
      if ((bVar17 | 2) == 0x2f) {
        pp_Var5 = __ctype_tolower_loc();
        iVar1 = (*pp_Var5)[(char)pbVar12[1]];
        iVar4 = (int)local_1b8;
        if (0x72 < iVar1) {
          if (iVar1 == 0x74) {
            local_180 = 1;
          }
          else {
            if (iVar1 != 0x73) goto LAB_00101486;
            bVar3 = pbVar12[2];
            if (((pbVar12[2] == 0) && (iVar4 = iVar4 + 1, bVar3 = bVar13, iVar4 < argc)) &&
               ((byte *)argv[iVar4] != (byte *)0x0)) {
              bVar13 = *argv[iVar4];
              goto LAB_001019c0;
            }
          }
          goto LAB_001019bb;
        }
        if (iVar1 != 100) {
          if ((iVar1 != 0x3f) && (iVar1 != 0x68)) {
LAB_00101486:
            if ((bVar17 != 0x2d) || (pbVar12[1] != 0)) goto LAB_00101496;
            local_1b0 = _stdin;
            local_1a8 = strdup("Sheet1");
            pcVar6 = strdup("data.xlsx");
            goto LAB_00101559;
          }
          goto LAB_00101389;
        }
        if (pbVar12[2] == 0) {
          iVar14 = iVar4 + 1;
          if (argc <= iVar14) goto LAB_001019c0;
          pbVar12 = (byte *)argv[iVar14];
          iVar4 = iVar14;
          if (pbVar12 == (byte *)0x0) goto LAB_001019bb;
        }
        else {
          pbVar12 = pbVar12 + 2;
        }
        local_188 = strtol((char *)pbVar12,(char **)0x0,10);
      }
      else {
LAB_00101496:
        local_1b0 = fopen((char *)pbVar12,"rb");
        if (local_1b0 == (FILE *)0x0) {
          main_cold_2();
          pcVar6 = (char *)0x0;
          local_1a8 = (char *)0x0;
        }
        else {
          pcVar6 = strdup(argv[iVar14]);
          if (pcVar6 != (char *)0x0) {
            pcVar7 = strrchr(pcVar6,0x2e);
            if (pcVar7 != (char *)0x0) {
              *pcVar7 = '\0';
            }
            sVar8 = strlen(pcVar6);
            uVar18 = sVar8 & 0xffffffff;
            do {
              uVar20 = uVar18;
              if ((int)uVar20 < 1) goto LAB_00101509;
              uVar18 = uVar20 - 1;
            } while (pcVar6[uVar20 - 1] != '/');
            memmove(pcVar6,pcVar6 + uVar20,sVar8 - (uVar20 - 1));
          }
LAB_00101509:
          pcVar7 = argv[iVar14];
          local_1a8 = pcVar6;
          sVar8 = strlen(pcVar7);
          pcVar6 = (char *)malloc(sVar8 + 6);
          if (pcVar6 == (char *)0x0) {
            main_cold_1();
            pcVar6 = (char *)0x0;
          }
          else {
            strcpy(pcVar6,pcVar7);
            sVar8 = strlen(pcVar6);
            builtin_strncpy(pcVar6 + sVar8,".xlsx",6);
LAB_00101559:
            if (((local_1a8 != (char *)0x0) && (local_1b0 != (FILE *)0x0)) &&
               (pcVar6 != (char *)0x0)) {
              local_168 = pcVar6;
              lVar9 = xlsxiowrite_open();
              if (lVar9 != 0) {
                xlsxiowrite_set_detection_rows(lVar9,local_188);
                local_198 = lVar9;
                xlsxiowrite_set_row_height(lVar9,1);
                sVar8 = fread(&local_1bb,1,3,local_1b0);
                if (((sVar8 != 3) || (local_1bb != -0x11)) ||
                   ((local_1ba != -0x45 || (local_1b9 != -0x41)))) {
                  fseek(local_1b0,0,0);
                }
                sVar8 = fread(local_138,1,0x100,local_1b0);
                if (sVar8 == 0) {
                  pvVar10 = (void *)0x0;
                }
                else {
                  bVar2 = true;
                  local_19c = 1;
                  bVar17 = 0;
                  lVar9 = 0;
                  pvVar10 = (void *)0x0;
                  do {
                    local_140 = -sVar8;
                    uVar20 = 1;
                    lVar19 = 0;
                    uVar18 = 0;
                    local_160 = sVar8;
                    bVar16 = bVar17;
                    do {
                      bVar17 = local_138[uVar20 - 1];
                      if (bVar2) {
                        if (bVar17 == bVar13 || bVar17 == 10) {
                          local_150 = uVar20 + (lVar9 - uVar18);
                          local_148 = lVar9;
                          pvVar10 = realloc(pvVar10,local_150);
                          lVar11 = local_148;
                          if (pvVar10 != (void *)0x0) {
                            local_178 = pvVar10;
                            local_158 = uVar18;
                            memcpy((void *)((long)pvVar10 + local_148),local_138 + uVar18,
                                   ~uVar18 + uVar20);
                            lVar15 = (lVar19 - uVar18) + lVar11;
                            if ((bVar17 == 10) && (local_150 != 1)) {
                              lVar15 = uVar20 + ((lVar11 - (ulong)(*(char *)((long)local_178 +
                                                                            (uVar20 - 2) +
                                                                            (lVar9 - uVar18)) ==
                                                                  '\r')) - local_158) + -1;
                            }
                            *(undefined1 *)((long)local_178 + lVar15) = 0;
                            pvVar10 = local_178;
                          }
                          if (local_19c == 0 || (int)local_180 == 0) {
                            xlsxiowrite_add_cell_string(local_198,pvVar10);
                          }
                          else {
                            xlsxiowrite_add_column(local_198,pvVar10,0);
                          }
                          uVar18 = lVar19 + 1;
                          free(pvVar10);
                          bVar2 = true;
                          if (bVar17 == 10) {
                            xlsxiowrite_next_row();
                            bVar17 = 10;
                            local_19c = 0;
                          }
                          pvVar10 = (void *)0x0;
                          lVar9 = 0;
                        }
                        else {
                          bVar2 = true;
                          if (bVar17 == 0x22) {
                            lVar11 = (lVar9 + (ulong)(bVar16 == 0x22)) - uVar18;
                            pvVar10 = realloc(pvVar10,uVar20 + lVar11);
                            if (pvVar10 == (void *)0x0) {
                              lVar9 = 0;
                            }
                            else {
                              memcpy((void *)(lVar9 + (long)pvVar10),local_138 + uVar18,
                                     (uVar20 + ((bVar16 == 0x22) - uVar18)) - 1);
                              lVar9 = uVar20 + lVar11 + -1;
                            }
                            bVar2 = false;
                            uVar18 = lVar19 + 1;
                            goto LAB_001017ff;
                          }
                        }
                      }
                      else if (bVar17 == 0x22) {
                        pvVar10 = realloc(pvVar10,uVar20 + (lVar9 - uVar18));
                        bVar2 = true;
                        if (pvVar10 == (void *)0x0) {
                          lVar9 = 0;
                          uVar18 = uVar20;
                        }
                        else {
                          memcpy((void *)((long)pvVar10 + lVar9),local_138 + uVar18,~uVar18 + uVar20
                                );
                          lVar9 = uVar20 + (lVar9 - uVar18) + -1;
                          uVar18 = uVar20;
                        }
LAB_001017ff:
                        bVar17 = 0x22;
                      }
                      else {
                        bVar2 = false;
                      }
                      lVar19 = lVar19 + 1;
                      lVar11 = local_140 + uVar20;
                      uVar20 = uVar20 + 1;
                      bVar16 = bVar17;
                    } while (lVar11 != 0);
                    sVar8 = local_160 - uVar18;
                    pvVar10 = realloc(pvVar10,lVar9 + sVar8 + 1);
                    if (pvVar10 == (void *)0x0) {
                      lVar9 = 0;
                    }
                    else {
                      memcpy((void *)((long)pvVar10 + lVar9),local_138 + uVar18,sVar8);
                      lVar9 = lVar9 + sVar8;
                    }
                    sVar8 = fread(local_138,1,0x100,local_1b0);
                  } while (sVar8 != 0);
                }
                xlsxiowrite_close(local_198);
                free(pvVar10);
                argv = local_170;
                argc = local_18c;
              }
              fclose(local_1b0);
              pcVar6 = local_168;
            }
          }
        }
        free(pcVar6);
        free(local_1a8);
LAB_001019bb:
        bVar13 = bVar3;
        iVar4 = (int)local_1b8;
      }
LAB_001019c0:
      local_1b8 = (ulong)(iVar4 + 1U);
    } while ((int)(iVar4 + 1U) < argc);
  }
  return 0;
}

Assistant:

int main (int argc, char* argv[])
{
  int i;
  char* param;
  FILE* src;
  char separator = ',';
  char quote = '"';
  int toprowheaders = 0;
  xlsxiowriter xlsxiowrite;
  char* sheetname;
  char* filename;
  size_t xlsxdetectionrows = DEFAULT_DETECTION_ROWS;
  //process command line parameters
  if (argc == 1) {
    show_help();
    return 0;
  }
  for (i = 1; i < argc; i++) {
    //check for command line parameters
    if (argv[i][0] && (argv[i][0] == '/' || argv[i][0] == '-')) {
      switch (tolower(argv[i][1])) {
        case 'h' :
        case '?' :
          show_help();
          return 0;
        case 's' :
          if (argv[i][2])
            param = argv[i] + 2;
          else if (i + 1 < argc && argv[i + 1])
            param = argv[++i];
          else
            param = NULL;
          if (param)
            separator = param[0];
          continue;
        case 'd' :
          if (argv[i][2])
            param = argv[i] + 2;
          else if (i + 1 < argc && argv[i + 1])
            param = argv[++i];
          else
            param = NULL;
          if (param)
            xlsxdetectionrows = strtol(param, (char**)NULL, 10);
          continue;
        case 't' :
          toprowheaders = 1;
          continue;
      }
    }
    //open CSV file
    sheetname = NULL;
    filename = NULL;
    src = NULL;
    if (strcmp(argv[i], "-") == 0) {
      src = stdin;
#ifdef _WIN32
      setmode(fileno(stdin), O_BINARY);
#endif
      sheetname = strdup("Sheet1");
      filename = strdup("data.xlsx");
    } else if ((src = fopen(argv[i], "rb")) == NULL) {
      fprintf(stderr, "Error opening file: %s\n", argv[i]);
    } else {
      //determine sheetname
      if ((sheetname = strdup(argv[i])) != NULL) {
        char* p;
        int i;
        //strip extension
        if ((p = strrchr(sheetname, '.')) != NULL)
          *p = 0;
        //strip path
        i = strlen(sheetname);
        while (i-- > 0) {
          if (sheetname[i] == '/'
#ifdef _WIN32
            || sheetname[i] == '\\'
#endif
          ) {
            memmove(sheetname, sheetname + i + 1, strlen(sheetname) - i);
            break;
          }
        }
      }
      //determine output filename
      if ((filename = (char*)malloc(strlen(argv[i]) + 6)) == NULL ){
        fprintf(stderr, "Memory allocation error\n");
      } else {
        strcpy(filename, argv[i]);
        strcat(filename, ".xlsx");
      }
    }
    if (src && filename && sheetname) {
      //create .xslx file
      if ((xlsxiowrite = xlsxiowrite_open(filename, sheetname)) != NULL) {
        xlsxiowrite_set_detection_rows(xlsxiowrite, xlsxdetectionrows);
        xlsxiowrite_set_row_height(xlsxiowrite, 1);
        //skip UTF-8 BOM header if present
        unsigned char bom[3];
        if (!(fread(bom, 1, 3, src) == 3 && bom[0] == 0xEF && bom[1] == 0xBB && bom[2] == 0xBF)) {
          fseek(src, 0, SEEK_SET);
        }
        //process CSV file
        char buf[BUFFER_SIZE];
        size_t buflen = 0;
        size_t bufstart = 0;
        size_t bufpos = 0;
        char* value = NULL;
        size_t valuelen = 0;
        size_t unquoted = 1;
        char lastchar = 0;
        int toprow = 1;
        //read data one buffer at a tome
        while ((buflen = fread(buf, 1, BUFFER_SIZE, src)) > 0) {
          //process each character in buffer
          while (bufpos < buflen) {
            if (unquoted) {
              if (buf[bufpos] == separator || buf[bufpos] == '\n') {
                //process end of cell
                append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
                bufstart = bufpos + 1;
                //detect CRLF line breaks and skip CR
                if (buf[bufpos] == '\n' && valuelen > 0 && value[valuelen - 1] == '\r')
                  valuelen--;
                //write cell value
                if (value)
                  value[valuelen] = 0;
                if (toprow && toprowheaders)
                  xlsxiowrite_add_column(xlsxiowrite, value, 0);
                else
                  xlsxiowrite_add_cell_string(xlsxiowrite, value);
                //clean up cell value
                free(value);
                value = NULL;
                valuelen = 0;
                //process end of line
                if (buf[bufpos] == '\n') {
                  xlsxiowrite_next_row(xlsxiowrite);
                  toprow = 0;
                }
              } else if (buf[bufpos] == quote) {
                //process upen quote
                append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart + (lastchar == quote ? 1 : 0));
                bufstart = bufpos + 1;
                unquoted = 0;
              }
            } else if (buf[bufpos] == quote) {
              //process close quote
              append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
              bufstart = bufpos + 1;
              unquoted = 1;
            }
            //prepare for processing next character
            lastchar = buf[bufpos];
            bufpos++;
          }
          //dump data at end of buffer and reset counters
          append_buffer_data(&value, &valuelen, buf + bufstart, bufpos - bufstart);
          bufstart = 0;
          bufpos = 0;
        }
        //close .xlsx file
        xlsxiowrite_close(xlsxiowrite);
        //clean up
        free(value);
      }
      //close CSV file
      fclose(src);
    }
    //clean up
    free(filename);
    free(sheetname);
  }
  return 0;
}